

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCall.cpp
# Opt level: O2

void __thiscall MockCheckedActualCall::checkExpectations(MockCheckedActualCall *this)

{
  MockExpectedCallsList *this_00;
  bool bVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  MockCheckedExpectedCall *pMVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockExpectedParameterDidntHappenFailure failure;
  SimpleString local_a0;
  TestFailure local_90;
  
  if (this->expectationsChecked_ != false) {
    return;
  }
  this->expectationsChecked_ = true;
  if (this->state_ == CALL_IN_PROGRESS) {
    this_00 = &this->potentiallyMatchingExpectations_;
    bVar1 = MockExpectedCallsList::hasFinalizedMatchingExpectations(this_00);
    if (bVar1) {
      pUVar3 = UtestShell::getCurrent();
      pTVar4 = UtestShell::getCurrentTestTerminator();
      (*pUVar3->_vptr_UtestShell[0x1a])
                (pUVar3,
                 "Actual call is in progress, but there are finalized matching expectations when checking expectations. This cannot happen."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockActualCall.cpp"
                 ,0x185,pTVar4);
    }
    pMVar5 = MockExpectedCallsList::removeFirstMatchingExpectation(this_00);
    this->matchingExpectation_ = pMVar5;
    if (pMVar5 == (MockCheckedExpectedCall *)0x0) {
      bVar1 = MockExpectedCallsList::hasUnmatchingExpectationsBecauseOfMissingParameters(this_00);
      if (bVar1) {
        iVar2 = (*(this->super_MockActualCall)._vptr_MockActualCall[0x33])(this);
        SimpleString::SimpleString(&local_a0,&this->functionName_);
        MockExpectedParameterDidntHappenFailure::MockExpectedParameterDidntHappenFailure
                  ((MockExpectedParameterDidntHappenFailure *)&local_90,
                   (UtestShell *)CONCAT44(extraout_var,iVar2),&local_a0,this->allExpectations_,
                   this_00);
        SimpleString::~SimpleString(&local_a0);
        (*(this->super_MockActualCall)._vptr_MockActualCall[0x37])(this,&local_90);
      }
      else {
        iVar2 = (*(this->super_MockActualCall)._vptr_MockActualCall[0x33])(this);
        SimpleString::SimpleString(&local_a0,&this->functionName_);
        MockExpectedObjectDidntHappenFailure::MockExpectedObjectDidntHappenFailure
                  ((MockExpectedObjectDidntHappenFailure *)&local_90,
                   (UtestShell *)CONCAT44(extraout_var_00,iVar2),&local_a0,this->allExpectations_);
        SimpleString::~SimpleString(&local_a0);
        (*(this->super_MockActualCall)._vptr_MockActualCall[0x37])(this,&local_90);
      }
      TestFailure::~TestFailure(&local_90);
      return;
    }
    (*(pMVar5->super_MockExpectedCall)._vptr_MockExpectedCall[0x39])(pMVar5);
    (*(this->super_MockActualCall)._vptr_MockActualCall[0x34])(this);
    (*(this->matchingExpectation_->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])
              (this->matchingExpectation_,(ulong)this->callOrder_);
  }
  else if (this->state_ == CALL_SUCCEED) {
    (*(this->matchingExpectation_->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])
              (this->matchingExpectation_,(ulong)this->callOrder_);
  }
  MockExpectedCallsList::resetActualCallMatchingState(&this->potentiallyMatchingExpectations_);
  return;
}

Assistant:

void MockCheckedActualCall::checkExpectations()
{
    if(expectationsChecked_) {
        return;
    }

    expectationsChecked_ = true;

    if (state_ != CALL_IN_PROGRESS) {
        if(state_ == CALL_SUCCEED) {
            matchingExpectation_->callWasMade(callOrder_);
        }
        potentiallyMatchingExpectations_.resetActualCallMatchingState();
        return;
    }

    if (potentiallyMatchingExpectations_.hasFinalizedMatchingExpectations())
        FAIL("Actual call is in progress, but there are finalized matching expectations when checking expectations. This cannot happen."); // LCOV_EXCL_LINE

    matchingExpectation_ = potentiallyMatchingExpectations_.removeFirstMatchingExpectation();
    if (matchingExpectation_) {
        matchingExpectation_->finalizeActualCallMatch();
        callHasSucceeded();
        matchingExpectation_->callWasMade(callOrder_);
        potentiallyMatchingExpectations_.resetActualCallMatchingState();
        return;
    }

    if (potentiallyMatchingExpectations_.hasUnmatchingExpectationsBecauseOfMissingParameters()) {
        MockExpectedParameterDidntHappenFailure failure(getTest(), getName(), allExpectations_, potentiallyMatchingExpectations_);
        failTest(failure);
    }
    else {
        MockExpectedObjectDidntHappenFailure failure(getTest(), getName(), allExpectations_);
        failTest(failure);
    }
}